

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void pq_in_clear(PktInQueue *pq)

{
  PktIn *pPVar1;
  
  (pq->pqb).ic = (IdempotentCallback *)0x0;
  do {
    pPVar1 = (*pq->after)(&pq->pqb,(PacketQueueNode *)pq,true);
  } while (pPVar1 != (PktIn *)0x0);
  return;
}

Assistant:

void pq_in_clear(PktInQueue *pq)
{
    PktIn *pkt;
    pq->pqb.ic = NULL;
    while ((pkt = pq_pop(pq)) != NULL) {
        /* No need to actually free these packets: pq_pop on a
         * PktInQueue will automatically move them to the free
         * queue. */
    }
}